

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O3

void sample_output<trng::lcg64>(lcg64 *r,string *name)

{
  ulong uVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  int iVar3;
  undefined8 uStack_28;
  
  uVar1 = name->_M_string_length;
  uStack_28 = in_RAX;
  while (uVar1 < 0x20) {
    std::__cxx11::string::push_back((char)name);
    uVar1 = name->_M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(name->_M_dataplus)._M_p,uVar1);
  iVar3 = 0xf;
  do {
    (r->S).r = (r->S).r * (r->P).a + (r->P).b;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    uStack_28._0_7_ = CONCAT16(9,(undefined6)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_28 + 6),1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  (r->S).r = (r->S).r * (r->P).a + (r->P).b;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_28 + 7),1);
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}